

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_0::CWriter::WritePrefixBinaryExpr(CWriter *this,Opcode opcode,char *op)

{
  Type type;
  size_t size;
  StackVar *in_RCX;
  char (*in_R8) [3];
  Newline *in_R9;
  Opcode opcode_local;
  char local_4c [12];
  StackVar local_40;
  StackVar local_34;
  
  opcode_local = opcode;
  type = Opcode::GetResultType(&opcode_local);
  local_40.index = 1;
  local_40.type.enum_ = Any;
  local_40.type.type_index_ = 0xffffffff;
  local_4c[0] = '\0';
  local_4c[1] = '\0';
  local_4c[2] = '\0';
  local_4c[3] = '\0';
  local_4c[4] = '\0';
  local_4c[5] = '\0';
  local_4c[6] = '\0';
  local_4c[7] = '\0';
  local_4c[8] = -1;
  local_4c[9] = -1;
  local_4c[10] = -1;
  local_4c[0xb] = -1;
  local_34.index = local_40.index;
  local_34.type = type;
  Write(this,&local_34);
  WriteData(this," = ",3);
  size = strlen(op);
  WriteData(this,op,size);
  WriteData(this,"(",1);
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,&local_40,(char (*) [3])local_4c,in_RCX,in_R8,in_R9);
  DropTypes(this,2);
  PushType(this,type);
  return;
}

Assistant:

void CWriter::WritePrefixBinaryExpr(Opcode opcode, const char* op) {
  Type result_type = opcode.GetResultType();
  Write(StackVar(1, result_type), " = ", op, "(", StackVar(1), ", ",
        StackVar(0), ");", Newline());
  DropTypes(2);
  PushType(result_type);
}